

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPClient.cpp
# Opt level: O2

ssize_t __thiscall
tiger::trains::network::TCPClient::send(TCPClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  void *pvVar2;
  void *pvVar3;
  
  pvVar2 = (void *)0x0;
  do {
    pvVar3 = pvVar2;
    if (__buf < pvVar2 || (void *)((long)__buf - (long)pvVar2) == (void *)0x0) break;
    sVar1 = TCPSocket::send(&this->tcpSocket,__fd + (int)pvVar2,(void *)((long)__buf - (long)pvVar2)
                            ,__n,__flags);
    pvVar2 = (void *)((long)pvVar2 + (long)(int)sVar1);
    pvVar3 = (void *)0xffffffffffffffff;
  } while ((int)sVar1 != -1);
  return (ulong)pvVar3 & 0xffffffff;
}

Assistant:

int TCPClient::send(const char *buffer, size_t bufferSize)
{
    size_t sent = 0;
    int lastSent = 0;

    while (sent < bufferSize)
    {
        lastSent = tcpSocket.send(buffer + sent, bufferSize - sent);

        if (lastSent == -1) break;

        sent += lastSent;
    }

    return lastSent == -1 ? -1 : sent;
}